

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O3

int archive_compressor_xz_options(archive_write_filter *f,char *key,char *value)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  
  puVar2 = (uint *)f->data;
  iVar3 = strcmp(key,"compression-level");
  if (iVar3 == 0) {
    iVar3 = -0x14;
    if (value != (char *)0x0) {
      bVar1 = *value - 0x30;
      if ((bVar1 < 10) && (value[1] == '\0')) {
        uVar7 = 6;
        if ((byte)*value < 0x37) {
          uVar7 = (uint)bVar1;
        }
        *puVar2 = uVar7;
        iVar3 = 0;
      }
    }
  }
  else {
    iVar4 = strcmp(key,"threads");
    iVar3 = -0x14;
    if ((value != (char *)0x0) && (iVar4 == 0)) {
      iVar3 = 0;
      uVar5 = strtoul(value,(char **)0x0,10);
      puVar2[1] = (uint)uVar5;
      if ((uint)uVar5 == 0) {
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        puVar2[1] = 1;
        iVar3 = -0x14;
        if (iVar4 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int
archive_compressor_xz_options(struct archive_write_filter *f,
    const char *key, const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		if (data->compression_level > 6)
			data->compression_level = 6;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		if (value == NULL)
			return (ARCHIVE_WARN);
		data->threads = (int)strtoul(value, NULL, 10);
		if (data->threads == 0 && errno != 0) {
			data->threads = 1;
			return (ARCHIVE_WARN);
		}
		if (data->threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			data->threads = lzma_cputhreads();
#else
			data->threads = 1;
#endif
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}